

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O3

nghttp2_ssize
send_callback(nghttp2_session *session,uint8_t *data,size_t length,int flags,void *user_data)

{
  bufferevent_write(*(undefined8 *)((long)user_data + 0x10));
  return length;
}

Assistant:

static nghttp2_ssize send_callback(nghttp2_session *session,
                                   const uint8_t *data, size_t length,
                                   int flags, void *user_data) {
  http2_session_data *session_data = (http2_session_data *)user_data;
  struct bufferevent *bev = session_data->bev;
  (void)session;
  (void)flags;

  bufferevent_write(bev, data, length);
  return (nghttp2_ssize)length;
}